

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O3

void lh_maybe_resize(_LHASH *lh)

{
  ulong uVar1;
  size_t new_num_buckets;
  
  if (lh->callback_depth == 0) {
    uVar1 = lh->num_buckets;
    if (uVar1 < 0x10) {
      __assert_fail("lh->num_buckets >= kMinNumBuckets",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/lhash/lhash.cc"
                    ,0xc9,"void lh_maybe_resize(_LHASH *)");
    }
    if (lh->num_items / uVar1 < 3) {
      if (uVar1 != 0x10 && lh->num_items < uVar1) {
        new_num_buckets = uVar1 >> 1;
        if (new_num_buckets < 0x11) {
          new_num_buckets = 0x10;
        }
        lh_rebucket(lh,new_num_buckets);
        return;
      }
    }
    else if (0 < (long)uVar1) {
      lh_rebucket(lh,uVar1 * 2);
      return;
    }
  }
  return;
}

Assistant:

static void lh_maybe_resize(_LHASH *lh) {
  size_t avg_chain_length;

  if (lh->callback_depth > 0) {
    // Don't resize the hash if we are currently iterating over it.
    return;
  }

  assert(lh->num_buckets >= kMinNumBuckets);
  avg_chain_length = lh->num_items / lh->num_buckets;

  if (avg_chain_length > kMaxAverageChainLength) {
    const size_t new_num_buckets = lh->num_buckets * 2;

    if (new_num_buckets > lh->num_buckets) {
      lh_rebucket(lh, new_num_buckets);
    }
  } else if (avg_chain_length < kMinAverageChainLength &&
             lh->num_buckets > kMinNumBuckets) {
    size_t new_num_buckets = lh->num_buckets / 2;

    if (new_num_buckets < kMinNumBuckets) {
      new_num_buckets = kMinNumBuckets;
    }

    lh_rebucket(lh, new_num_buckets);
  }
}